

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O0

void sha256_sw_round(uint round_index,uint32_t *schedule,uint32_t *a,uint32_t *b,uint32_t *c,
                    uint32_t *d,uint32_t *e,uint32_t *f,uint32_t *g,uint32_t *h)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t t2;
  uint32_t t1;
  uint32_t *d_local;
  uint32_t *c_local;
  uint32_t *b_local;
  uint32_t *a_local;
  uint32_t *schedule_local;
  uint round_index_local;
  
  uVar4 = *h;
  uVar1 = Sigma_1(*e);
  uVar2 = Ch(*e,*f,*g);
  iVar3 = uVar4 + uVar1 + uVar2 + sha256_round_constants[round_index] + schedule[round_index];
  uVar4 = Sigma_0(*a);
  uVar1 = Maj(*a,*b,*c);
  *d = iVar3 + *d;
  *h = iVar3 + uVar4 + uVar1;
  return;
}

Assistant:

static inline void sha256_sw_round(
    unsigned round_index, const uint32_t *schedule,
    uint32_t *a, uint32_t *b, uint32_t *c, uint32_t *d,
    uint32_t *e, uint32_t *f, uint32_t *g, uint32_t *h)
{
    uint32_t t1 = *h + Sigma_1(*e) + Ch(*e,*f,*g) +
        sha256_round_constants[round_index] + schedule[round_index];

    uint32_t t2 = Sigma_0(*a) + Maj(*a,*b,*c);

    *d += t1;
    *h = t1 + t2;
}